

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_daemon.c
# Opt level: O0

int daemon_init(char *pidfile)

{
  uint uVar1;
  int iVar2;
  int pid;
  char *pidfile_local;
  
  uVar1 = check_pid(pidfile);
  if (uVar1 == 0) {
    iVar2 = daemon(1,0);
    if (iVar2 == 0) {
      iVar2 = write_pid(pidfile);
      if (iVar2 == 0) {
        pidfile_local._4_4_ = 1;
      }
      else {
        pidfile_local._4_4_ = 0;
      }
    }
    else {
      fprintf(_stderr,"Can\'t daemonize.\n");
      pidfile_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"Skynet is already running, pid = %d.\n",(ulong)uVar1);
    pidfile_local._4_4_ = 1;
  }
  return pidfile_local._4_4_;
}

Assistant:

int
daemon_init(const char *pidfile) {
	int pid = check_pid(pidfile);

	if (pid) {
		fprintf(stderr, "Skynet is already running, pid = %d.\n", pid);
		return 1;
	}

#ifdef __APPLE__
	fprintf(stderr, "'daemon' is deprecated: first deprecated in OS X 10.5 , use launchd instead.\n");
#else
	if (daemon(1,0)) {
		fprintf(stderr, "Can't daemonize.\n");
		return 1;
	}
#endif

	pid = write_pid(pidfile);
	if (pid == 0) {
		return 1;
	}

	return 0;
}